

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall FIX::CheckSumField::CheckSumField(CheckSumField *this,int field,int data)

{
  string sStack_38;
  
  CheckSumConvertor::convert_abi_cxx11_(&sStack_38,(CheckSumConvertor *)(ulong)(uint)data,data);
  FieldBase::FieldBase(&this->super_FieldBase,field,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001fd630;
  return;
}

Assistant:

explicit CheckSumField(int field, int data)
      : FieldBase(field, CheckSumConvertor::convert(data)) {}